

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O1

int __thiscall
CVmObjBigNum::getp_get_scale(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  short sVar1;
  char *pcVar2;
  int iVar3;
  
  if (getp_get_scale(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_scale();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_scale::desc);
  if (iVar3 == 0) {
    pcVar2 = (this->super_CVmObject).ext_;
    if ((pcVar2[4] & 6U) == 0) {
      sVar1 = *(short *)(pcVar2 + 2);
      retval->typ = VM_INT;
      *(int *)&retval->val = (int)sVar1;
    }
    else {
      retval->typ = VM_NIL;
    }
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_get_scale(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* check the type */
    if (is_nan(ext_))
    {
        /* it's not a number - return nil for the scale */
        retval->set_nil();
    }
    else
    {
        /* return an integer giving the number's scale */
        retval->set_int(get_exp(ext_));
    }
    
    /* handled */
    return TRUE;
}